

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithDepsLogTestRestatMissingDepfileDepslog::Run
          (BuildWithDepsLogTestRestatMissingDepfileDepslog *this)

{
  Test *pTVar1;
  bool bVar2;
  size_type sVar3;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  undefined4 local_160;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *manifest;
  string err;
  BuildWithDepsLogTestRestatMissingDepfileDepslog *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&manifest);
  local_38 = 
  "rule true\n  command = true\n  restat = 1\nbuild header.h: true header.in\nbuild out: cat header.h\n  deps = gcc\n  depfile = out.d\n"
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"header.in",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  VirtualFileSystem::Create
            (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"out.d",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"out: header.h",&local_e1);
  VirtualFileSystem::Create
            (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_b8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"header.h",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"",&local_131);
  VirtualFileSystem::Create
            (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_108,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"out",&local_159);
  BuildTest::RebuildTarget
            ((BuildTest *)this,&local_158,local_38,"build_log","ninja_deps",(State *)0x0);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pTVar1 = g_current_test;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.commands_ran_);
  bVar2 = testing::Test::Check
                    (pTVar1,sVar3 == 2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0xb38,"2u == command_runner_.commands_ran_.size()");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"out",&local_181);
    BuildTest::RebuildTarget
              ((BuildTest *)this,&local_180,local_38,"build_log","ninja_deps",(State *)0x0);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    pTVar1 = g_current_test;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.commands_ran_
                  );
    bVar2 = testing::Test::Check
                      (pTVar1,sVar3 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xb3c,"0u == command_runner_.commands_ran_.size()");
    if (bVar2) {
      VirtualFileSystem::Tick(&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"header.in",&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"",&local_1d1);
      VirtualFileSystem::Create
                (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_1a8,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"out",&local_1f9);
      BuildTest::RebuildTarget
                ((BuildTest *)this,&local_1f8,local_38,"build_log","ninja_deps2",(State *)0x0);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      pTVar1 = g_current_test;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                      commands_ran_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar3 == 2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xb46,"2u == command_runner_.commands_ran_.size()");
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"out",&local_221);
        BuildTest::RebuildTarget
                  ((BuildTest *)this,&local_220,local_38,"build_log","ninja_deps2",(State *)0x0);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator(&local_221);
        pTVar1 = g_current_test;
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                        commands_ran_);
        bVar2 = testing::Test::Check
                          (pTVar1,sVar3 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0xb4a,"0u == command_runner_.commands_ran_.size()");
        if (bVar2) {
          VirtualFileSystem::Tick(&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"header.in",&local_249);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"",&local_271);
          VirtualFileSystem::Create
                    (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_248,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"out",&local_299);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
          VirtualFileSystem::Create
                    (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_298,&local_2c0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::allocator<char>::~allocator(&local_2c1);
          std::__cxx11::string::~string((string *)&local_298);
          std::allocator<char>::~allocator(&local_299);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"out",&local_2e9);
          BuildTest::RebuildTarget
                    ((BuildTest *)this,&local_2e8,local_38,"build_log","ninja_deps2",(State *)0x0);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::allocator<char>::~allocator(&local_2e9);
          pTVar1 = g_current_test;
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                          commands_ran_);
          bVar2 = testing::Test::Check
                            (pTVar1,sVar3 == 2,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0xb52,"2u == command_runner_.commands_ran_.size()");
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_310,"out",&local_311);
            BuildTest::RebuildTarget
                      ((BuildTest *)this,&local_310,local_38,"build_log","ninja_deps2",(State *)0x0)
            ;
            std::__cxx11::string::~string((string *)&local_310);
            std::allocator<char>::~allocator(&local_311);
            pTVar1 = g_current_test;
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                            commands_ran_);
            bVar2 = testing::Test::Check
                              (pTVar1,sVar3 == 0,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0xb56,"0u == command_runner_.commands_ran_.size()");
            if (bVar2) {
              local_160 = 0;
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              local_160 = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            local_160 = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_160 = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_160 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_160 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_160 = 1;
  }
  std::__cxx11::string::~string((string *)&manifest);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, RestatMissingDepfileDepslog) {
  string err;
  const char* manifest =
"rule true\n"
"  command = true\n"  // Would be "write if out-of-date" in reality.
"  restat = 1\n"
"build header.h: true header.in\n"
"build out: cat header.h\n"
"  deps = gcc\n"
"  depfile = out.d\n";

  // Build once to populate ninja deps logs from out.d
  fs_.Create("header.in", "");
  fs_.Create("out.d", "out: header.h");
  fs_.Create("header.h", "");

  RebuildTarget("out", manifest, "build_log", "ninja_deps");
  ASSERT_EQ(2u, command_runner_.commands_ran_.size());

  // Sanity: this rebuild should be NOOP
  RebuildTarget("out", manifest, "build_log", "ninja_deps");
  ASSERT_EQ(0u, command_runner_.commands_ran_.size());

  // Touch 'header.in', blank dependencies log (create a different one).
  // Building header.h triggers 'restat' outputs cleanup.
  // Validate that out is rebuilt netherless, as deps are missing.
  fs_.Tick();
  fs_.Create("header.in", "");

  // (switch to a new blank deps_log "ninja_deps2")
  RebuildTarget("out", manifest, "build_log", "ninja_deps2");
  ASSERT_EQ(2u, command_runner_.commands_ran_.size());

  // Sanity: this build should be NOOP
  RebuildTarget("out", manifest, "build_log", "ninja_deps2");
  ASSERT_EQ(0u, command_runner_.commands_ran_.size());

  // Check that invalidating deps by target timestamp also works here
  // Repeat the test but touch target instead of blanking the log.
  fs_.Tick();
  fs_.Create("header.in", "");
  fs_.Create("out", "");
  RebuildTarget("out", manifest, "build_log", "ninja_deps2");
  ASSERT_EQ(2u, command_runner_.commands_ran_.size());

  // And this build should be NOOP again
  RebuildTarget("out", manifest, "build_log", "ninja_deps2");
  ASSERT_EQ(0u, command_runner_.commands_ran_.size());
}